

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlFAParseCharClassEsc(xmlRegParserCtxtPtr ctxt)

{
  int iVar1;
  xmlRegAtomPtr pxVar2;
  xmlRegAtomType local_18;
  uint local_14;
  xmlRegAtomType type;
  int cur;
  xmlRegParserCtxtPtr ctxt_local;
  
  if (*ctxt->cur == '.') {
    if (ctxt->atom == (xmlRegAtomPtr)0x0) {
      pxVar2 = xmlRegNewAtom(ctxt,XML_REGEXP_ANYCHAR);
      ctxt->atom = pxVar2;
    }
    else if (ctxt->atom->type == XML_REGEXP_RANGES) {
      xmlRegAtomAddRange(ctxt,ctxt->atom,ctxt->neg,XML_REGEXP_ANYCHAR,0,0,(xmlChar *)0x0);
    }
    ctxt->cur = ctxt->cur + 1;
  }
  else if (*ctxt->cur == '\\') {
    ctxt->cur = ctxt->cur + 1;
    local_14 = (uint)*ctxt->cur;
    if (local_14 == 0x70) {
      ctxt->cur = ctxt->cur + 1;
      if (*ctxt->cur == '{') {
        ctxt->cur = ctxt->cur + 1;
        xmlFAParseCharProp(ctxt);
        if (*ctxt->cur == '}') {
          ctxt->cur = ctxt->cur + 1;
        }
        else {
          ctxt->error = 0x5aa;
          xmlRegexpErrCompile(ctxt,"Expecting \'}\'");
        }
      }
      else {
        ctxt->error = 0x5aa;
        xmlRegexpErrCompile(ctxt,"Expecting \'{\'");
      }
    }
    else if (local_14 == 0x50) {
      ctxt->cur = ctxt->cur + 1;
      if (*ctxt->cur == '{') {
        ctxt->cur = ctxt->cur + 1;
        xmlFAParseCharProp(ctxt);
        if (ctxt->atom != (xmlRegAtomPtr)0x0) {
          ctxt->atom->neg = 1;
        }
        if (*ctxt->cur == '}') {
          ctxt->cur = ctxt->cur + 1;
        }
        else {
          ctxt->error = 0x5aa;
          xmlRegexpErrCompile(ctxt,"Expecting \'}\'");
        }
      }
      else {
        ctxt->error = 0x5aa;
        xmlRegexpErrCompile(ctxt,"Expecting \'{\'");
      }
    }
    else if ((((((local_14 == 0x6e) || (local_14 == 0x72)) || (local_14 == 0x74)) ||
              (((local_14 == 0x5c || (local_14 == 0x7c)) ||
               ((local_14 == 0x2e || ((local_14 == 0x3f || (local_14 == 0x2a)))))))) ||
             ((((local_14 == 0x2b ||
                ((((local_14 == 0x28 || (local_14 == 0x29)) || (local_14 == 0x7b)) ||
                 ((local_14 == 0x7d || (local_14 == 0x2d)))))) ||
               (((local_14 == 0x5b || ((local_14 == 0x5d || (local_14 == 0x5e)))) ||
                (local_14 == 0x21)))) ||
              ((((local_14 == 0x22 || (local_14 == 0x23)) || (local_14 == 0x24)) ||
               ((local_14 == 0x25 || (local_14 == 0x2c)))))))) ||
            ((((local_14 == 0x2f || ((local_14 == 0x3a || (local_14 == 0x3b)))) ||
              (local_14 == 0x3d)) ||
             ((((local_14 == 0x3e || (local_14 == 0x40)) || (local_14 == 0x60)) ||
              ((local_14 == 0x7e || (local_14 == 0x75)))))))) {
      if (ctxt->atom == (xmlRegAtomPtr)0x0) {
        pxVar2 = xmlRegNewAtom(ctxt,XML_REGEXP_CHARVAL);
        ctxt->atom = pxVar2;
        if (ctxt->atom != (xmlRegAtomPtr)0x0) {
          switch(local_14) {
          case 0x6e:
            ctxt->atom->codepoint = 10;
            break;
          default:
            ctxt->atom->codepoint = local_14;
            break;
          case 0x72:
            ctxt->atom->codepoint = 0xd;
            break;
          case 0x74:
            ctxt->atom->codepoint = 9;
            break;
          case 0x75:
            iVar1 = parse_escaped_codepoint(ctxt);
            if (iVar1 < 0) {
              return;
            }
            ctxt->atom->codepoint = iVar1;
          }
        }
      }
      else if (ctxt->atom->type == XML_REGEXP_RANGES) {
        if (local_14 == 0x6e) {
          local_14 = 10;
        }
        else if (local_14 == 0x72) {
          local_14 = 0xd;
        }
        else if (local_14 == 0x74) {
          local_14 = 9;
        }
        xmlRegAtomAddRange(ctxt,ctxt->atom,ctxt->neg,XML_REGEXP_CHARVAL,local_14,local_14,
                           (xmlChar *)0x0);
      }
      ctxt->cur = ctxt->cur + 1;
    }
    else if (((((local_14 == 0x73) || (local_14 == 0x53)) ||
              ((local_14 == 0x69 ||
               ((((local_14 == 0x49 || (local_14 == 99)) || (local_14 == 0x43)) ||
                ((local_14 == 100 || (local_14 == 0x44)))))))) || (local_14 == 0x77)) ||
            (local_14 == 0x57)) {
      local_18 = XML_REGEXP_ANYSPACE;
      switch(local_14) {
      case 0x43:
        local_18 = XML_REGEXP_NOTNAMECHAR;
        break;
      case 0x44:
        local_18 = XML_REGEXP_NOTDECIMAL;
        break;
      case 0x49:
        local_18 = XML_REGEXP_NOTINITNAME;
        break;
      case 0x53:
        local_18 = XML_REGEXP_NOTSPACE;
        break;
      case 0x57:
        local_18 = XML_REGEXP_NOTREALCHAR;
        break;
      case 99:
        local_18 = XML_REGEXP_NAMECHAR;
        break;
      case 100:
        local_18 = XML_REGEXP_DECIMAL;
        break;
      case 0x69:
        local_18 = XML_REGEXP_INITNAME;
        break;
      case 0x73:
        local_18 = XML_REGEXP_ANYSPACE;
        break;
      case 0x77:
        local_18 = XML_REGEXP_REALCHAR;
      }
      ctxt->cur = ctxt->cur + 1;
      if (ctxt->atom == (xmlRegAtomPtr)0x0) {
        pxVar2 = xmlRegNewAtom(ctxt,local_18);
        ctxt->atom = pxVar2;
      }
      else if (ctxt->atom->type == XML_REGEXP_RANGES) {
        xmlRegAtomAddRange(ctxt,ctxt->atom,ctxt->neg,local_18,0,0,(xmlChar *)0x0);
      }
    }
    else {
      ctxt->error = 0x5aa;
      xmlRegexpErrCompile(ctxt,"Wrong escape sequence, misuse of character \'\\\'");
    }
  }
  else {
    ctxt->error = 0x5aa;
    xmlRegexpErrCompile(ctxt,"Escaped sequence: expecting \\");
  }
  return;
}

Assistant:

static void
xmlFAParseCharClassEsc(xmlRegParserCtxtPtr ctxt) {
    int cur;

    if (CUR == '.') {
	if (ctxt->atom == NULL) {
	    ctxt->atom = xmlRegNewAtom(ctxt, XML_REGEXP_ANYCHAR);
	} else if (ctxt->atom->type == XML_REGEXP_RANGES) {
	    xmlRegAtomAddRange(ctxt, ctxt->atom, ctxt->neg,
			       XML_REGEXP_ANYCHAR, 0, 0, NULL);
	}
	NEXT;
	return;
    }
    if (CUR != '\\') {
	ERROR("Escaped sequence: expecting \\");
	return;
    }
    NEXT;
    cur = CUR;
    if (cur == 'p') {
	NEXT;
	if (CUR != '{') {
	    ERROR("Expecting '{'");
	    return;
	}
	NEXT;
	xmlFAParseCharProp(ctxt);
	if (CUR != '}') {
	    ERROR("Expecting '}'");
	    return;
	}
	NEXT;
    } else if (cur == 'P') {
	NEXT;
	if (CUR != '{') {
	    ERROR("Expecting '{'");
	    return;
	}
	NEXT;
	xmlFAParseCharProp(ctxt);
        if (ctxt->atom != NULL)
	    ctxt->atom->neg = 1;
	if (CUR != '}') {
	    ERROR("Expecting '}'");
	    return;
	}
	NEXT;
    } else if ((cur == 'n') || (cur == 'r') || (cur == 't') || (cur == '\\') ||
	(cur == '|') || (cur == '.') || (cur == '?') || (cur == '*') ||
	(cur == '+') || (cur == '(') || (cur == ')') || (cur == '{') ||
	(cur == '}') || (cur == 0x2D) || (cur == 0x5B) || (cur == 0x5D) ||
	(cur == 0x5E) ||

	/* Non-standard escape sequences:
	 *                  Java 1.8|.NET Core 3.1|MSXML 6 */
	(cur == '!') ||     /*   +  |     +       |    +   */
	(cur == '"') ||     /*   +  |     +       |    +   */
	(cur == '#') ||     /*   +  |     +       |    +   */
	(cur == '$') ||     /*   +  |     +       |    +   */
	(cur == '%') ||     /*   +  |     +       |    +   */
	(cur == ',') ||     /*   +  |     +       |    +   */
	(cur == '/') ||     /*   +  |     +       |    +   */
	(cur == ':') ||     /*   +  |     +       |    +   */
	(cur == ';') ||     /*   +  |     +       |    +   */
	(cur == '=') ||     /*   +  |     +       |    +   */
	(cur == '>') ||     /*      |     +       |    +   */
	(cur == '@') ||     /*   +  |     +       |    +   */
	(cur == '`') ||     /*   +  |     +       |    +   */
	(cur == '~') ||     /*   +  |     +       |    +   */
	(cur == 'u')) {     /*      |     +       |    +   */
	if (ctxt->atom == NULL) {
	    ctxt->atom = xmlRegNewAtom(ctxt, XML_REGEXP_CHARVAL);
	    if (ctxt->atom != NULL) {
	        switch (cur) {
		    case 'n':
		        ctxt->atom->codepoint = '\n';
			break;
		    case 'r':
		        ctxt->atom->codepoint = '\r';
			break;
		    case 't':
		        ctxt->atom->codepoint = '\t';
			break;
		    case 'u':
			cur = parse_escaped_codepoint(ctxt);
			if (cur < 0) {
			    return;
			}
			ctxt->atom->codepoint = cur;
			break;
		    default:
			ctxt->atom->codepoint = cur;
		}
	    }
	} else if (ctxt->atom->type == XML_REGEXP_RANGES) {
            switch (cur) {
                case 'n':
                    cur = '\n';
                    break;
                case 'r':
                    cur = '\r';
                    break;
                case 't':
                    cur = '\t';
                    break;
            }
	    xmlRegAtomAddRange(ctxt, ctxt->atom, ctxt->neg,
			       XML_REGEXP_CHARVAL, cur, cur, NULL);
	}
	NEXT;
    } else if ((cur == 's') || (cur == 'S') || (cur == 'i') || (cur == 'I') ||
	(cur == 'c') || (cur == 'C') || (cur == 'd') || (cur == 'D') ||
	(cur == 'w') || (cur == 'W')) {
	xmlRegAtomType type = XML_REGEXP_ANYSPACE;

	switch (cur) {
	    case 's':
		type = XML_REGEXP_ANYSPACE;
		break;
	    case 'S':
		type = XML_REGEXP_NOTSPACE;
		break;
	    case 'i':
		type = XML_REGEXP_INITNAME;
		break;
	    case 'I':
		type = XML_REGEXP_NOTINITNAME;
		break;
	    case 'c':
		type = XML_REGEXP_NAMECHAR;
		break;
	    case 'C':
		type = XML_REGEXP_NOTNAMECHAR;
		break;
	    case 'd':
		type = XML_REGEXP_DECIMAL;
		break;
	    case 'D':
		type = XML_REGEXP_NOTDECIMAL;
		break;
	    case 'w':
		type = XML_REGEXP_REALCHAR;
		break;
	    case 'W':
		type = XML_REGEXP_NOTREALCHAR;
		break;
	}
	NEXT;
	if (ctxt->atom == NULL) {
	    ctxt->atom = xmlRegNewAtom(ctxt, type);
	} else if (ctxt->atom->type == XML_REGEXP_RANGES) {
	    xmlRegAtomAddRange(ctxt, ctxt->atom, ctxt->neg,
			       type, 0, 0, NULL);
	}
    } else {
	ERROR("Wrong escape sequence, misuse of character '\\'");
    }
}